

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpDblAJ(word *b,word *a,ec_o *ec,void *stack)

{
  bool_t bVar1;
  word *pwVar2;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  long in_RDI;
  word *t4;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  word *n_00;
  word *mod;
  word *mod_00;
  word *b_00;
  
  mod_00 = *(word **)(in_RDX[3] + 0x30);
  mod = in_RCX + (long)mod_00;
  n_00 = mod + (long)mod_00;
  pwVar2 = n_00 + (long)mod_00;
  b_00 = pwVar2 + (long)mod_00;
  bVar1 = wwIsZero(in_RSI + (long)mod_00,*(size_t *)(in_RDX[3] + 0x30));
  if (bVar1 == 0) {
    (**(code **)(in_RDX[3] + 0x70))(in_RCX,in_RSI,in_RDX[3],b_00);
    (**(code **)(in_RDX[3] + 0x70))(mod,in_RSI + (long)mod_00,in_RDX[3],b_00);
    (**(code **)(in_RDX[3] + 0x70))(n_00,mod,in_RDX[3],b_00);
    zzAddMod(in_RSI,in_RDX,b_00,mod_00,(size_t)in_RCX);
    (**(code **)(in_RDX[3] + 0x70))(mod,mod,in_RDX[3],b_00);
    zzSubMod(b_00,mod_00,in_RCX,mod,(size_t)n_00);
    zzSubMod(b_00,mod_00,in_RCX,mod,(size_t)n_00);
    zzDoubleMod(in_RSI,in_RDX,b_00,(size_t)mod_00);
    zzDoubleMod(in_RSI,in_RDX,b_00,(size_t)mod_00);
    zzAddMod(in_RSI,in_RDX,b_00,mod_00,(size_t)in_RCX);
    zzAddMod(in_RSI,in_RDX,b_00,mod_00,(size_t)in_RCX);
    zzDoubleMod(in_RSI,in_RDX,b_00,(size_t)mod_00);
    (**(code **)(in_RDX[3] + 0x70))(in_RDI,pwVar2,in_RDX[3],b_00);
    zzSubMod(b_00,mod_00,in_RCX,mod,(size_t)n_00);
    zzDoubleMod(in_RSI,in_RDX,b_00,(size_t)mod_00);
    zzSubMod(b_00,mod_00,in_RCX,mod,(size_t)n_00);
    (**(code **)(in_RDX[3] + 0x68))(in_RDI + (long)mod_00 * 8,pwVar2,mod,in_RDX[3],b_00);
    zzDoubleMod(in_RSI,in_RDX,b_00,(size_t)mod_00);
    zzDoubleMod(in_RSI,in_RDX,b_00,(size_t)mod_00);
    zzDoubleMod(in_RSI,in_RDX,b_00,(size_t)mod_00);
    zzSubMod(b_00,mod_00,in_RCX,mod,(size_t)n_00);
  }
  else {
    wwSetZero((word *)(in_RDI + (long)mod_00 * 0x10),*(size_t *)(in_RDX[3] + 0x30));
  }
  return;
}

Assistant:

static void ecpDblAJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	stack = t4 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOnA(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 2 * n, b, 3 * n));
	// ya == 0? => b <- O
	if (qrIsZero(ecY(a, n), ec->f))
	{
		qrSetZero(ecZ(b, n), ec->f);
		return;
	}
	// t1 <- xa^2 [X1^2 = XX]
	qrSqr(t1, ecX(a), ec->f, stack);
	// t2 <- ya^2 [Y1^2 = YY]
	qrSqr(t2, ecY(a, n), ec->f, stack);
	// t3 <- t2^2 [YY^2 = YYYY]
	qrSqr(t3, t2, ec->f, stack);
	// t2 <- t2 + xa [X1 + YY]
	zmAdd(t2, t2, ecX(a), ec->f);
	// t2 <- t2^2 [(X1 + YY)^2]
	qrSqr(t2, t2, ec->f, stack);
	// t2 <- t2 - t1 [(X1 + YY)^2 - XX]
	zmSub(t2, t2, t1, ec->f);
	// t2 <- t2 - t3 [(X1 + YY)^2 - XX - YYYY]
	zmSub(t2, t2, t3, ec->f);
	// t2 <- 2 t2 [2((X1 + YY)^2 - XX - YYYY) = S]
	gfpDouble(t2, t2, ec->f);
	// t4 <- 2 t1 [2 XX]
	gfpDouble(t4, t1, ec->f);
	// t4 <- t4 + t1 [3 XX]
	zmAdd(t4, t4, t1, ec->f);
	// t4 <- t4 + A [3 XX + A = M]
	zmAdd(t4, t4, ec->A, ec->f);
	// t1 <- 2 t2 [2S]
	gfpDouble(t1, t2, ec->f);
	// xb <- t4^2 [M^2]
	qrSqr(ecX(b), t4, ec->f, stack);
	// xb <- xb - t1 [M^2 - 2S = T]
	zmSub(ecX(b), ecX(b), t1, ec->f);
	// zb <- 2 ya [2Y1]
	gfpDouble(ecZ(b, n), ecY(a, n), ec->f);
	// t2 <- t2 - xb [S - T]
	zmSub(t2, t2, ecX(b), ec->f);
	// yb <- t4 t2 [M(S - T)]
	qrMul(ecY(b, n), t4, t2, ec->f, stack);
	// t3 <- 2 t3 [2 YYYY]
	gfpDouble(t3, t3, ec->f);
	// t3 <- 2 t3 [4 YYYY]
	gfpDouble(t3, t3, ec->f);
	// t3 <- 2 t3 [8 YYYY]
	gfpDouble(t3, t3, ec->f);
	// yb <- yb - t3 [M(S - T) - 8 YYYY]
	zmSub(ecY(b, n), ecY(b, n), t3, ec->f);
}